

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  __m128i *palVar5;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar6;
  __m128i *palVar7;
  __m128i *b_00;
  long lVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  undefined8 extraout_RDX;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong size;
  __m128i *ptr;
  long lVar18;
  uint a;
  uint uVar19;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  undefined1 auVar20 [16];
  int iVar24;
  uint uVar26;
  uint uVar27;
  undefined1 auVar25 [16];
  int iVar28;
  uint uVar29;
  int iVar33;
  ulong uVar30;
  uint uVar34;
  int iVar35;
  undefined1 auVar31 [16];
  int iVar36;
  undefined1 auVar32 [16];
  int iVar37;
  int iVar39;
  int iVar40;
  int iVar41;
  undefined1 auVar38 [16];
  int iVar42;
  int iVar45;
  int iVar46;
  int iVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i c;
  __m128i c_00;
  uint local_c4;
  ulong local_b0;
  ulong local_a8;
  size_t len;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          parasail_sw_table_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_sse41_128_32_cold_4();
        }
        else {
          local_b0 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_sse41_128_32_cold_1();
          }
          else {
            uVar12 = (ulong)uVar16 + 3;
            uVar10 = 0x7ffffffe - ppVar4->max;
            uVar15 = (ulong)uVar10;
            a = (uint)uVar12 & 0x7ffffffc;
            result = parasail_result_new_table1(a,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar12 >> 2;
              result->flag = result->flag | 0x4420804;
              b = parasail_memalign___m128i(0x10,size);
              palVar6 = parasail_memalign___m128i(0x10,size);
              palVar7 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              bVar9 = palVar6 == (__m128i *)0x0 || b == (__m128i *)0x0;
              len = CONCAT71((int7)(uVar15 >> 8),bVar9);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_00 == (__m128i *)0x0 || palVar7 == (__m128i *)0x0) || bVar9;
              if ((b_00 != (__m128i *)0x0 && palVar7 != (__m128i *)0x0) &&
                  (palVar6 != (__m128i *)0x0 && b != (__m128i *)0x0)) {
                local_a8 = 0;
                c[0] = size;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                auVar52._4_4_ = open;
                auVar52._0_4_ = open;
                auVar52._8_4_ = open;
                auVar52._12_4_ = open;
                iVar24 = (int)size;
                lVar13 = size * local_b0;
                local_c4 = 0xc0000000;
                uVar19 = 0xc0000000;
                uVar21 = 0xc0000000;
                uVar22 = 0xc0000000;
                uVar23 = 0xc0000000;
                lVar14 = 0;
                uVar15 = 0;
                uVar29 = uVar19;
                uVar34 = uVar21;
                uVar26 = uVar22;
                uVar27 = uVar23;
                do {
                  ptr = b;
                  iVar11 = ppVar4->mapper[(byte)s2[uVar15]];
                  palVar5 = palVar7;
                  b = palVar6;
                  if ((int)local_a8 == (int)uVar15 + -2) {
                    palVar5 = palVar6;
                    b = palVar7;
                  }
                  palVar7 = palVar5;
                  palVar6 = ptr + (iVar24 - 1);
                  iVar39 = (int)(*palVar6)[0];
                  iVar40 = *(int *)((long)*palVar6 + 4);
                  iVar41 = (int)(*palVar6)[1];
                  iVar37 = 0;
                  lVar8 = 0;
                  auVar31 = (undefined1  [16])0x0;
                  lVar17 = lVar14;
                  do {
                    piVar1 = (int *)((long)pvVar3 + lVar8 + (long)iVar11 * size * 0x10);
                    iVar37 = iVar37 + *piVar1;
                    iVar39 = iVar39 + piVar1[1];
                    iVar40 = iVar40 + piVar1[2];
                    iVar41 = iVar41 + piVar1[3];
                    piVar1 = (int *)((long)*b_00 + lVar8);
                    iVar42 = *piVar1;
                    iVar45 = piVar1[1];
                    iVar46 = piVar1[2];
                    iVar47 = piVar1[3];
                    iVar28 = auVar31._0_4_;
                    uVar48 = (uint)(iVar42 < iVar28) * iVar28 | (uint)(iVar42 >= iVar28) * iVar42;
                    iVar33 = auVar31._4_4_;
                    uVar49 = (uint)(iVar45 < iVar33) * iVar33 | (uint)(iVar45 >= iVar33) * iVar45;
                    iVar35 = auVar31._8_4_;
                    uVar50 = (uint)(iVar46 < iVar35) * iVar35 | (uint)(iVar46 >= iVar35) * iVar46;
                    iVar36 = auVar31._12_4_;
                    uVar51 = (uint)(iVar47 < iVar36) * iVar36 | (uint)(iVar47 >= iVar36) * iVar47;
                    uVar48 = (uint)((int)uVar48 < iVar37) * iVar37 |
                             ((int)uVar48 >= iVar37) * uVar48;
                    uVar49 = (uint)((int)uVar49 < iVar39) * iVar39 |
                             ((int)uVar49 >= iVar39) * uVar49;
                    uVar50 = (uint)((int)uVar50 < iVar40) * iVar40 |
                             ((int)uVar50 >= iVar40) * uVar50;
                    uVar51 = (uint)((int)uVar51 < iVar41) * iVar41 |
                             ((int)uVar51 >= iVar41) * uVar51;
                    iVar39 = (-1 < (int)uVar48) * uVar48;
                    iVar37 = (-1 < (int)uVar49) * uVar49;
                    iVar40 = (-1 < (int)uVar50) * uVar50;
                    iVar41 = (-1 < (int)uVar51) * uVar51;
                    piVar1 = (int *)((long)*b + lVar8);
                    *piVar1 = iVar39;
                    piVar1[1] = iVar37;
                    piVar1[2] = iVar40;
                    piVar1[3] = iVar41;
                    piVar1 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar1 + lVar17) = iVar39;
                    *(int *)((long)piVar1 + lVar13 * 4 + lVar17) = iVar37;
                    *(int *)((long)piVar1 + lVar13 * 8 + lVar17) = iVar40;
                    *(int *)((long)piVar1 + lVar13 * 0xc + lVar17) = iVar41;
                    uVar19 = (uint)((int)uVar19 < iVar39) * iVar39 |
                             ((int)uVar19 >= iVar39) * uVar19;
                    uVar21 = (uint)((int)uVar21 < iVar37) * iVar37 |
                             ((int)uVar21 >= iVar37) * uVar21;
                    uVar22 = (uint)((int)uVar22 < iVar40) * iVar40 |
                             ((int)uVar22 >= iVar40) * uVar22;
                    uVar23 = (uint)((int)uVar23 < iVar41) * iVar41 |
                             ((int)uVar23 >= iVar41) * uVar23;
                    auVar53._0_4_ = iVar39 - open;
                    auVar53._4_4_ = iVar37 - open;
                    auVar53._8_4_ = iVar40 - open;
                    auVar53._12_4_ = iVar41 - open;
                    iVar42 = iVar42 - gap;
                    iVar45 = iVar45 - gap;
                    iVar46 = iVar46 - gap;
                    iVar47 = iVar47 - gap;
                    puVar2 = (uint *)((long)*b_00 + lVar8);
                    *puVar2 = (uint)(iVar42 < auVar53._0_4_) * auVar53._0_4_ |
                              (uint)(iVar42 >= auVar53._0_4_) * iVar42;
                    puVar2[1] = (uint)(iVar45 < auVar53._4_4_) * auVar53._4_4_ |
                                (uint)(iVar45 >= auVar53._4_4_) * iVar45;
                    puVar2[2] = (uint)(iVar46 < auVar53._8_4_) * auVar53._8_4_ |
                                (uint)(iVar46 >= auVar53._8_4_) * iVar46;
                    puVar2[3] = (uint)(iVar47 < auVar53._12_4_) * auVar53._12_4_ |
                                (uint)(iVar47 >= auVar53._12_4_) * iVar47;
                    iVar28 = iVar28 - gap;
                    iVar33 = iVar33 - gap;
                    iVar35 = iVar35 - gap;
                    iVar36 = iVar36 - gap;
                    auVar31._0_4_ =
                         (uint)(iVar28 < auVar53._0_4_) * auVar53._0_4_ |
                         (uint)(iVar28 >= auVar53._0_4_) * iVar28;
                    auVar31._4_4_ =
                         (uint)(iVar33 < auVar53._4_4_) * auVar53._4_4_ |
                         (uint)(iVar33 >= auVar53._4_4_) * iVar33;
                    auVar31._8_4_ =
                         (uint)(iVar35 < auVar53._8_4_) * auVar53._8_4_ |
                         (uint)(iVar35 >= auVar53._8_4_) * iVar35;
                    auVar31._12_4_ =
                         (uint)(iVar36 < auVar53._12_4_) * auVar53._12_4_ |
                         (uint)(iVar36 >= auVar53._12_4_) * iVar36;
                    piVar1 = (int *)((long)*ptr + lVar8);
                    iVar37 = *piVar1;
                    iVar39 = piVar1[1];
                    iVar40 = piVar1[2];
                    iVar41 = piVar1[3];
                    lVar8 = lVar8 + 0x10;
                    lVar17 = lVar17 + local_b0 * 4;
                  } while (size << 4 != lVar8);
                  iVar11 = 0;
                  do {
                    lVar17 = auVar31._8_8_;
                    uVar30 = auVar31._0_8_;
                    auVar31._0_8_ = uVar30 << 0x20;
                    auVar31._8_8_ = lVar17 << 0x20 | uVar30 >> 0x20;
                    lVar8 = 0;
                    lVar17 = lVar14;
                    do {
                      piVar1 = (int *)((long)*b + lVar8);
                      iVar39 = *piVar1;
                      iVar40 = piVar1[1];
                      iVar41 = piVar1[2];
                      iVar28 = piVar1[3];
                      iVar37 = auVar31._0_4_;
                      uVar48 = (uint)(iVar39 < iVar37) * iVar37 | (uint)(iVar39 >= iVar37) * iVar39;
                      iVar39 = auVar31._4_4_;
                      uVar49 = (uint)(iVar40 < iVar39) * iVar39 | (uint)(iVar40 >= iVar39) * iVar40;
                      iVar40 = auVar31._8_4_;
                      uVar50 = (uint)(iVar41 < iVar40) * iVar40 | (uint)(iVar41 >= iVar40) * iVar41;
                      iVar41 = auVar31._12_4_;
                      uVar51 = (uint)(iVar28 < iVar41) * iVar41 | (uint)(iVar28 >= iVar41) * iVar28;
                      puVar2 = (uint *)((long)*b + lVar8);
                      *puVar2 = uVar48;
                      puVar2[1] = uVar49;
                      puVar2[2] = uVar50;
                      puVar2[3] = uVar51;
                      piVar1 = ((result->field_4).rowcols)->score_row;
                      *(uint *)((long)piVar1 + lVar17) = uVar48;
                      lVar18 = (long)piVar1 + lVar17;
                      *(uint *)(lVar13 * 4 + lVar18) = uVar49;
                      *(uint *)(lVar13 * 8 + lVar18) = uVar50;
                      *(uint *)(lVar13 * 0xc + lVar18) = uVar51;
                      uVar19 = ((int)uVar19 < (int)uVar48) * uVar48 |
                               ((int)uVar19 >= (int)uVar48) * uVar19;
                      uVar21 = ((int)uVar21 < (int)uVar49) * uVar49 |
                               ((int)uVar21 >= (int)uVar49) * uVar21;
                      uVar22 = ((int)uVar22 < (int)uVar50) * uVar50 |
                               ((int)uVar22 >= (int)uVar50) * uVar22;
                      uVar23 = ((int)uVar23 < (int)uVar51) * uVar51 |
                               ((int)uVar23 >= (int)uVar51) * uVar23;
                      auVar31._0_4_ = iVar37 - gap;
                      auVar31._4_4_ = iVar39 - gap;
                      auVar31._8_4_ = iVar40 - gap;
                      auVar31._12_4_ = iVar41 - gap;
                      auVar43._0_4_ = -(uint)((int)(uVar48 - open) < (int)auVar31._0_4_);
                      auVar43._4_4_ = -(uint)((int)(uVar49 - open) < (int)auVar31._4_4_);
                      auVar43._8_4_ = -(uint)((int)(uVar50 - open) < (int)auVar31._8_4_);
                      auVar43._12_4_ = -(uint)((int)(uVar51 - open) < (int)auVar31._12_4_);
                      iVar37 = movmskps((int)lVar18,auVar43);
                      if (iVar37 == 0) goto LAB_006c65d0;
                      lVar8 = lVar8 + 0x10;
                      lVar17 = lVar17 + local_b0 * 4;
                    } while (size << 4 != lVar8);
                    iVar11 = iVar11 + 1;
                  } while (iVar11 != 4);
LAB_006c65d0:
                  auVar32._0_4_ = -(uint)((int)uVar29 < (int)uVar19);
                  auVar32._4_4_ = -(uint)((int)uVar34 < (int)uVar21);
                  auVar32._8_4_ = -(uint)((int)uVar26 < (int)uVar22);
                  auVar32._12_4_ = -(uint)((int)uVar27 < (int)uVar23);
                  iVar11 = movmskps((int)lVar17,auVar32);
                  if (iVar11 != 0) {
                    uVar29 = ((int)uVar22 < (int)uVar19) * uVar19 |
                             ((int)uVar22 >= (int)uVar19) * uVar22;
                    uVar34 = ((int)uVar23 < (int)uVar21) * uVar21 |
                             ((int)uVar23 >= (int)uVar21) * uVar23;
                    uVar29 = ((int)uVar34 < (int)uVar29) * uVar29 |
                             ((int)uVar34 >= (int)uVar29) * uVar34;
                    local_c4 = uVar29;
                    if ((int)uVar10 < (int)uVar29) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      local_b0 = uVar15;
                      break;
                    }
                    local_a8 = uVar15 & 0xffffffff;
                    uVar34 = uVar29;
                    uVar26 = uVar29;
                    uVar27 = uVar29;
                  }
                  uVar15 = uVar15 + 1;
                  lVar14 = lVar14 + 4;
                  palVar6 = ptr;
                } while (uVar15 != local_b0);
                if (local_c4 == 0x7fffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar11 = parasail_result_is_saturated(result);
                palVar6 = palVar7;
                if (iVar11 == 0) {
                  palVar5 = ptr;
                  if ((int)local_a8 == (int)local_b0 + -2) {
                    palVar6 = ptr;
                    palVar5 = palVar7;
                  }
                  if ((int)local_a8 == (int)local_b0 + -1) {
                    palVar6 = b;
                    b = palVar7;
                    palVar5 = ptr;
                  }
                  ptr = palVar5;
                  uVar16 = uVar16 - 1;
                  bVar9 = (uVar12 & 0x7ffffffc) == 0;
                  if (!bVar9) {
                    if (bVar9) {
                      uVar12 = 0;
                      do {
                        uVar10 = (uint)(uVar12 >> 2) & 0x3fffffff;
                        if ((int)uVar16 <= (int)uVar10) {
                          uVar10 = uVar16;
                        }
                        if (*(uint *)((long)*palVar6 + uVar12 * 4) != local_c4) {
                          uVar10 = uVar16;
                        }
                        uVar16 = uVar10;
                        uVar12 = uVar12 + 1;
                      } while ((int)uVar12 != 0);
                    }
                    else {
                      auVar25._4_4_ = uVar16;
                      auVar25._0_4_ = uVar16;
                      auVar25._8_4_ = uVar16;
                      auVar25._12_4_ = uVar16;
                      auVar38._4_4_ = iVar24;
                      auVar38._0_4_ = iVar24;
                      auVar38._8_4_ = iVar24;
                      auVar38._12_4_ = iVar24;
                      auVar44 = pmovsxbd(auVar43,0x3020100);
                      uVar12 = 0;
                      auVar31 = pmovsxbd(auVar53,0x3030303);
                      auVar52 = pmovsxbd(auVar52,0x4040404);
                      do {
                        puVar2 = (uint *)((long)*palVar6 + uVar12 * 4);
                        auVar20._0_4_ = -(uint)(*puVar2 == local_c4);
                        auVar20._4_4_ = -(uint)(puVar2[1] == local_c4);
                        auVar20._8_4_ = -(uint)(puVar2[2] == local_c4);
                        auVar20._12_4_ = -(uint)(puVar2[3] == local_c4);
                        uVar16 = auVar44._4_4_;
                        uVar10 = auVar44._8_4_;
                        uVar29 = auVar44._12_4_;
                        auVar53 = pmulld(auVar44 & auVar31,auVar38);
                        iVar11 = auVar53._0_4_ + (auVar44._0_4_ >> 2);
                        iVar37 = auVar53._4_4_ + (uVar16 >> 2);
                        iVar39 = auVar53._8_4_ + (uVar10 >> 2);
                        iVar40 = auVar53._12_4_ + (uVar29 >> 2);
                        iVar24 = auVar25._0_4_;
                        auVar54._0_4_ =
                             (uint)(iVar24 < iVar11) * iVar24 | (uint)(iVar24 >= iVar11) * iVar11;
                        iVar24 = auVar25._4_4_;
                        auVar54._4_4_ =
                             (uint)(iVar24 < iVar37) * iVar24 | (uint)(iVar24 >= iVar37) * iVar37;
                        iVar24 = auVar25._8_4_;
                        auVar54._8_4_ =
                             (uint)(iVar24 < iVar39) * iVar24 | (uint)(iVar24 >= iVar39) * iVar39;
                        iVar24 = auVar25._12_4_;
                        auVar54._12_4_ =
                             (uint)(iVar24 < iVar40) * iVar24 | (uint)(iVar24 >= iVar40) * iVar40;
                        auVar25 = blendvps(auVar25,auVar54,auVar20);
                        uVar12 = uVar12 + 4;
                        auVar44._0_4_ = auVar44._0_4_ + auVar52._0_4_;
                        auVar44._4_4_ = uVar16 + auVar52._4_4_;
                        auVar44._8_4_ = uVar10 + auVar52._8_4_;
                        auVar44._12_4_ = uVar29 + auVar52._12_4_;
                      } while (a != uVar12);
                      iVar24 = auVar25._0_4_;
                      iVar11 = auVar25._4_4_;
                      iVar37 = auVar25._8_4_;
                      iVar39 = auVar25._12_4_;
                      uVar16 = (uint)(iVar24 < iVar37) * iVar24 | (uint)(iVar24 >= iVar37) * iVar37;
                      uVar10 = (uint)(iVar11 < iVar39) * iVar11 | (uint)(iVar11 >= iVar39) * iVar39;
                      uVar16 = ((int)uVar16 < (int)uVar10) * uVar16 |
                               ((int)uVar16 >= (int)uVar10) * uVar10;
                    }
                  }
                }
                else {
                  local_a8._0_4_ = 0;
                  local_c4 = 0x7fffffff;
                  uVar16 = 0;
                }
                result->score = local_c4;
                result->end_query = uVar16;
                result->end_ref = (int)local_a8;
                parasail_free(b_00);
                parasail_free(palVar6);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            vH = _mm_max_epi32(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi32(vH, vMaxH);
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}